

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

UnreachableInst * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::UnreachableInst>(LLVMContext *this)

{
  UnreachableInst *this_00;
  
  this_00 = (UnreachableInst *)allocate(this,0x70,8);
  if (this_00 != (UnreachableInst *)0x0) {
    UnreachableInst::UnreachableInst(this_00);
    append_typed_destructor<LLVMBC::UnreachableInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}